

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O1

bool __thiscall
icu_63::numparse::impl::DecimalMatcher::smokeTest(DecimalMatcher *this,StringSegment *segment)

{
  ulong uVar1;
  bool bVar2;
  UBool UVar3;
  UChar32 c;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  if (((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr ==
       (UnicodeString *)0x0) && (this->leadSet != (UnicodeSet *)0x0)) {
    bVar2 = StringSegment::startsWith(segment,this->leadSet);
    return bVar2;
  }
  bVar2 = StringSegment::startsWith(segment,this->separatorSet);
  bVar6 = true;
  if (!bVar2) {
    c = StringSegment::getCodePoint(segment);
    UVar3 = u_isdigit_63(c);
    if (UVar3 == '\0') {
      if ((this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr ==
          (UnicodeString *)0x0) {
        bVar6 = false;
      }
      else {
        bVar2 = StringSegment::startsWith
                          (segment,(this->fLocalDigitStrings).
                                   super_LocalPointerBase<const_icu_63::UnicodeString>.ptr);
        if (!bVar2) {
          lVar5 = 0x40;
          uVar1 = 0;
          do {
            uVar4 = uVar1;
            if (uVar4 == 9) break;
            bVar2 = StringSegment::startsWith
                              (segment,(UnicodeString *)
                                       ((long)&(((this->fLocalDigitStrings).
                                                 super_LocalPointerBase<const_icu_63::UnicodeString>
                                                .ptr)->super_Replaceable).super_UObject.
                                               _vptr_UObject + lVar5));
            lVar5 = lVar5 + 0x40;
            uVar1 = uVar4 + 1;
          } while (!bVar2);
          bVar6 = uVar4 < 9;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool DecimalMatcher::smokeTest(const StringSegment& segment) const {
    // The common case uses a static leadSet for efficiency.
    if (fLocalDigitStrings.isNull() && leadSet != nullptr) {
        return segment.startsWith(*leadSet);
    }
    if (segment.startsWith(*separatorSet) || u_isdigit(segment.getCodePoint())) {
        return true;
    }
    if (fLocalDigitStrings.isNull()) {
        return false;
    }
    for (int32_t i = 0; i < 10; i++) {
        if (segment.startsWith(fLocalDigitStrings[i])) {
            return true;
        }
    }
    return false;
}